

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::ShaderSubroutine::NegativeTest12::getVertexShader_abi_cxx11_
          (string *__return_storage_ptr__,NegativeTest12 *this,_test_case *test_case)

{
  ulong uVar1;
  stringstream result_sstream;
  stringstream local_1a0 [16];
  undefined1 local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nsubroutine void subroutineType(inout vec4 test);\n\nsubroutine(subroutineType) void test_function(inout vec4 test)\n{\n    test += vec4(0, 1, 2, 3);\n}\n\nsubroutine uniform subroutineType function;\n\n"
             ,0xfe);
  uVar1 = (ulong)*test_case;
  if (uVar1 < 5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,&DAT_01a60708 + *(int *)(&DAT_01a60708 + uVar1 * 4),
               *(long *)(&DAT_01a60720 + uVar1 * 8));
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string NegativeTest12::getVertexShader(const _test_case& test_case)
{
	std::stringstream result_sstream;

	/* Form pre-amble */
	result_sstream << "#version 400\n"
					  "\n"
					  "#extension GL_ARB_shader_subroutine : require\n"
					  "\n"
					  /* Define a subroutine */
					  "subroutine void subroutineType(inout vec4 test);\n"
					  "\n"
					  "subroutine(subroutineType) void test_function(inout vec4 test)\n"
					  "{\n"
					  "    test += vec4(0, 1, 2, 3);\n"
					  "}\n"
					  "\n"
					  "subroutine uniform subroutineType function;\n"
					  "\n";

	/* Include case-specific implementation */
	switch (test_case)
	{
	case TEST_CASE_INVALID_LOCAL_SUBROUTINE_VARIABLE:
	{
		result_sstream << "void main()\n"
						  "{\n"
						  "    subroutine subroutineType function2;\n"
						  "    vec4                      result;\n"
						  "\n"
						  "    function2(result);\n"
						  "    gl_Position = result;\n"
						  "}\n";

		break;
	}

	case TEST_CASE_INVALID_GLOBAL_SUBROUTINE_VARIABLE:
	{
		result_sstream << "subroutine subroutineType function2;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    vec4 result;\n"
						  "\n"
						  "    function2(result);\n"
						  "    gl_Position = result;\n"
						  "}\n";

		break;
	}

	case TEST_CASE_SUBROUTINE_USED_AS_CONSTRUCTOR:
	{
		result_sstream << "void main()\n"
						  "{\n"
						  "    subroutineType(function);\n"
						  "}\n";

		break;
	}

	case TEST_CASE_SUBROUTINE_USED_AS_CONSTRUCTOR_ARGUMENT:
	{
		result_sstream << "vec4 test_function(subroutineType argument)\n"
						  "{\n"
						  "    vec4 result = vec4(1, 2, 3, 4);\n"
						  "\n"
						  "    argument(result);\n"
						  "\n"
						  "    return result;\n"
						  "}\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    test_function(function);\n"
						  "}\n";

		break;
	}

	case TEST_CASE_SUBROUTINE_USED_AS_CONSTRUCTOR_RETURN_TYPE:
	{
		result_sstream << "subroutineType test_function()\n"
						  "{\n"
						  "    return function;\n"
						  "}\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    test_function()(gl_Position);\n"
						  "}\n";

		break;
	}

	default:
		break;
	} /* switch (test_case) */

	/* Done */
	return result_sstream.str();
}